

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O0

bool __thiscall stk::FileWrite::setRawFile(FileWrite *this,string *fileName)

{
  long lVar1;
  char *__filename;
  FILE *pFVar2;
  ostream *poVar3;
  string *fileName_local;
  FileWrite *this_local;
  
  lVar1 = std::__cxx11::string::find((char *)fileName,0x11f0ac);
  if (lVar1 == -1) {
    std::__cxx11::string::operator+=((string *)fileName,".raw");
  }
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar2 = fopen(__filename,"wb");
  this->fd_ = (FILE *)pFVar2;
  if (this->fd_ == (FILE *)0x0) {
    poVar3 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileWrite: could not create RAW file: ");
    poVar3 = std::operator<<(poVar3,(string *)fileName);
    std::operator<<(poVar3,'.');
    this_local._7_1_ = false;
  }
  else {
    if (this->dataType_ != 2) {
      this->dataType_ = 2;
      poVar3 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                               "FileWrite: using 16-bit signed integer data format for file ");
      poVar3 = std::operator<<(poVar3,(string *)fileName);
      std::operator<<(poVar3,'.');
      Stk::handleError(&this->super_Stk,WARNING);
    }
    this->byteswap_ = false;
    this->byteswap_ = true;
    poVar3 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,"FileWrite: creating RAW file: ");
    std::operator<<(poVar3,(string *)fileName);
    Stk::handleError(&this->super_Stk,STATUS);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FileWrite :: setRawFile( std::string fileName )
{
  if ( fileName.find( ".raw" ) == std::string::npos ) fileName += ".raw";
  fd_ = fopen( fileName.c_str(), "wb" );
  if ( !fd_ ) {
    oStream_ << "FileWrite: could not create RAW file: " << fileName << '.';
    return false;
  }

  if ( dataType_ != STK_SINT16 ) {
    dataType_ = STK_SINT16;
    oStream_ << "FileWrite: using 16-bit signed integer data format for file " << fileName << '.';
    handleError( StkError::WARNING );
  }

  byteswap_ = false;
#ifdef __LITTLE_ENDIAN__
  byteswap_ = true;
#endif

  oStream_ << "FileWrite: creating RAW file: " << fileName;
  handleError( StkError::STATUS );
  return true;
}